

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QImage>::emplace<QImage>
          (QMovableArrayOps<QImage> *this,qsizetype i,QImage *args)

{
  QImage **ppQVar1;
  qsizetype *pqVar2;
  QPaintDevice *this_00;
  Data *pDVar3;
  long lVar4;
  QImage *pQVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter local_80;
  undefined8 *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0010601a:
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_58 = (undefined8 *)0xaaaaaaaaaaaaaaaa;
    uStack_50 = 0xaaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
    local_58 = &QImageIOPlugin::staticMetaObject;
    local_48 = *(undefined8 *)(args + 0x10);
    *(undefined8 *)(args + 0x10) = 0;
    bVar7 = (this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.size != 0;
    QArrayDataPointer<QImage>::detachAndGrow
              ((QArrayDataPointer<QImage> *)this,(uint)(i == 0 && bVar7),1,(QImage **)0x0,
               (QArrayDataPointer<QImage> *)0x0);
    if (i == 0 && bVar7) {
      pQVar5 = (this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr;
      QPaintDevice::QPaintDevice((QPaintDevice *)(pQVar5 + -0x18));
      uVar6 = local_48;
      *(undefined8 **)(pQVar5 + -0x18) = &QImageIOPlugin::staticMetaObject;
      local_48 = 0;
      *(undefined8 *)(pQVar5 + -8) = uVar6;
      ppQVar1 = &(this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr;
      *ppQVar1 = *ppQVar1 + -0x18;
      pqVar2 = &(this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_80.displaceTo =
           (this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr;
      local_80.displaceFrom = local_80.displaceTo + i * 0x18;
      local_80.displaceTo = local_80.displaceTo + i * 0x18 + 0x18;
      local_80.nInserts = 1;
      local_80.bytes =
           ((this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.size - i) * 0x18;
      local_80.data = (QArrayDataPointer<QImage> *)this;
      memmove(local_80.displaceTo,local_80.displaceFrom,local_80.bytes);
      pQVar5 = local_80.displaceFrom;
      QPaintDevice::QPaintDevice((QPaintDevice *)local_80.displaceFrom);
      uVar6 = local_48;
      *(undefined8 **)pQVar5 = &QImageIOPlugin::staticMetaObject;
      local_48 = 0;
      *(undefined8 *)(pQVar5 + 0x10) = uVar6;
      local_80.displaceFrom = local_80.displaceFrom + 0x18;
      Inserter::~Inserter(&local_80);
    }
    QImage::~QImage((QImage *)&local_58);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      this_00 = (QPaintDevice *)
                ((this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr +
                lVar4 * 0x18);
      QPaintDevice::QPaintDevice(this_00);
      *(undefined8 **)this_00 = &QImageIOPlugin::staticMetaObject;
      uVar6 = *(undefined8 *)(args + 0x10);
      *(undefined8 *)(args + 0x10) = 0;
      *(undefined8 *)(this_00 + 0x10) = uVar6;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QImage *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr))
      goto LAB_0010601a;
      pQVar5 = (this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr;
      QPaintDevice::QPaintDevice((QPaintDevice *)(pQVar5 + -0x18));
      *(undefined8 **)(pQVar5 + -0x18) = &QImageIOPlugin::staticMetaObject;
      uVar6 = *(undefined8 *)(args + 0x10);
      *(undefined8 *)(args + 0x10) = 0;
      *(undefined8 *)(pQVar5 + -8) = uVar6;
      ppQVar1 = &(this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr;
      *ppQVar1 = *ppQVar1 + -0x18;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }